

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_5_lambda(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPParserContext *parser;
  PVIPNode *pPVar1;
  PVIPNode *n1;
  PVIPNode *n3;
  
  if (G->val[-2] == (PVIPNode *)0x0) {
    pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_PARAMS);
    G->val[-2] = pPVar1;
  }
  parser = &G->data;
  n1 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
  pPVar1 = G->val[-2];
  n3 = PVIP_node_new_children(parser,PVIP_NODE_NOP);
  pPVar1 = PVIP_node_new_children4(parser,PVIP_NODE_FUNC,n1,pPVar1,n3,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_5_lambda(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define p G->val[-2]
  yyprintf((stderr, "do yy_5_lambda"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        if (!p) {\n\
            p = PVIP_node_new_children(&(G->data), PVIP_NODE_PARAMS);\n\
        }\n\
        yy = PVIP_node_new_children4(&(G->data), PVIP_NODE_FUNC, PVIP_node_new_children(&(G->data), PVIP_NODE_NOP), p, NOP(), b);\n\
    }\n"));
  
        if (!p) {
            p = PVIP_node_new_children(&(G->data), PVIP_NODE_PARAMS);
        }
        yy = PVIP_node_new_children4(&(G->data), PVIP_NODE_FUNC, PVIP_node_new_children(&(G->data), PVIP_NODE_NOP), p, NOP(), b);
    ;
#undef b
#undef p
}